

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::averageDownCoeffsToCoarseAmrLevel(MLABecLaplacian *this,int flev)

{
  reference S_crse;
  reference pvVar1;
  reference pvVar2;
  undefined4 in_ESI;
  size_type in_RDI;
  value_type *crse_b_coeffs;
  value_type *crse_a_coeffs;
  value_type *fine_b_coeffs;
  value_type *fine_a_coeffs;
  array<amrex::MultiFab,_3UL> *in_stack_ffffffffffffff90;
  Geometry *in_stack_ffffffffffffff98;
  IntVect *in_stack_ffffffffffffffa0;
  Array<MultiFab_*,_3> *in_stack_ffffffffffffffa8;
  Array<const_MultiFab_*,_3> *in_stack_ffffffffffffffb0;
  int rr;
  undefined4 in_stack_fffffffffffffff0;
  
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffff90,in_RDI);
  S_crse = std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                     ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_ffffffffffffff90);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffff90,in_RDI);
  pvVar1 = std::
           vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           ::back((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   *)in_stack_ffffffffffffff90);
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffff90,in_RDI);
  pvVar2 = std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::front
                     ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_ffffffffffffff90);
  rr = (int)((ulong)pvVar2 >> 0x20);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffff90,in_RDI);
  std::vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ::front((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           *)in_stack_ffffffffffffff90);
  if ((*(double *)(in_RDI + 0x328) != 0.0) || (NAN(*(double *)(in_RDI + 0x328)))) {
    average_down((MultiFab *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),S_crse,
                 (int)((ulong)pvVar1 >> 0x20),(int)pvVar1,rr);
  }
  GetArrOfConstPtrs<amrex::MultiFab>(in_stack_ffffffffffffff90);
  GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            (in_stack_ffffffffffffff90);
  IntVect::IntVect((IntVect *)&stack0xffffffffffffff94,2);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffff90,in_RDI);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_ffffffffffffff90,
             in_RDI);
  average_down_faces(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
  return;
}

Assistant:

void
MLABecLaplacian::averageDownCoeffsToCoarseAmrLevel (int flev)
{
    auto& fine_a_coeffs = m_a_coeffs[flev  ].back();
    auto& fine_b_coeffs = m_b_coeffs[flev  ].back();
    auto& crse_a_coeffs = m_a_coeffs[flev-1].front();
    auto& crse_b_coeffs = m_b_coeffs[flev-1].front();

    if (m_a_scalar != 0.0) {
        // We coarsen from the back of flev to the front of flev-1.
        // So we use mg_coarsen_ratio.
        amrex::average_down(fine_a_coeffs, crse_a_coeffs, 0, 1, mg_coarsen_ratio);
    }

    amrex::average_down_faces(amrex::GetArrOfConstPtrs(fine_b_coeffs),
                              amrex::GetArrOfPtrs(crse_b_coeffs),
                              IntVect(mg_coarsen_ratio), m_geom[flev-1][0]);
}